

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_nbwait_notify(Integer *nbhandle)

{
  int i;
  ulong uVar1;
  gai_putn_hdl_t *pgVar2;
  
  pgVar2 = putn_handles;
  uVar1 = 0;
  do {
    if (pgVar2->orighdl == nbhandle) goto LAB_0016cf8a;
    uVar1 = uVar1 + 1;
    pgVar2 = pgVar2 + 1;
  } while (uVar1 != 100);
  uVar1 = 100;
LAB_0016cf8a:
  if ((uint)uVar1 < 100) {
    uVar1 = uVar1 & 0xffffffff;
    nga_wait_internal(&putn_handles[uVar1].firsthdl);
    nga_wait_internal(&putn_handles[uVar1].elementhdl);
    if (putn_handles[uVar1].elem_copy != (void *)0x0) {
      free(putn_handles[uVar1].elem_copy);
      putn_handles[uVar1].elem_copy = (void *)0x0;
    }
    putn_handles[uVar1].orighdl = (Integer *)0x0;
  }
  return;
}

Assistant:

void pnga_nbwait_notify(Integer *nbhandle)
{
  int i;

  for (i = 0; i < HANDLES_OUTSTANDING; i++)
    if (putn_handles[i].orighdl == nbhandle)
      break;

  if (i >= HANDLES_OUTSTANDING)
    return; /* Incorrect handle used or maybe wait was called multiple times? */

  nga_wait_internal(&putn_handles[i].firsthdl);
  nga_wait_internal(&putn_handles[i].elementhdl);

  if (putn_handles[i].elem_copy) {
    free(putn_handles[i].elem_copy);
    putn_handles[i].elem_copy = NULL;
  }

  putn_handles[i].orighdl = NULL;
}